

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbar_mugshot.cpp
# Opt level: O3

bool __thiscall FMugShot::SetState(FMugShot *this,char *state_name,bool wait_till_done,bool reset)

{
  FMugShotState *pFVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  FMugShotState *pFVar6;
  
  iVar2 = FName::NameManager::FindName(&FName::NameData,state_name,true);
  pFVar6 = MugShotStates.Array;
  for (uVar5 = (ulong)MugShotStates.Count; uVar5 != 0; uVar5 = uVar5 - 1) {
    if ((pFVar6->State).Index == iVar2) goto LAB_00628ba2;
    pFVar6 = pFVar6 + 1;
  }
  pcVar4 = strchr(state_name,0x2e);
  if (pcVar4 != (char *)0x0) {
    iVar2 = FName::NameManager::FindName
                      (&FName::NameData,state_name,(long)pcVar4 - (long)state_name,true);
    pFVar6 = MugShotStates.Array;
    for (uVar5 = (ulong)MugShotStates.Count; uVar5 != 0; uVar5 = uVar5 - 1) {
      if ((pFVar6->State).Index == iVar2) {
LAB_00628ba2:
        this->bNormal = false;
        this->bOuchActive = false;
        pFVar1 = this->CurrentState;
        if (pFVar6 == pFVar1) {
          if (!reset) {
            return true;
          }
        }
        else {
          if ((wait_till_done && pFVar1 != (FMugShotState *)0x0) &&
             ((undefined1  [40])((undefined1  [40])*pFVar1 & (undefined1  [40])0x10) ==
              (undefined1  [40])0x0)) {
            return false;
          }
          this->CurrentState = pFVar6;
        }
        pFVar6->Time = ((pFVar6->Frames).Array)->Delay;
        pFVar6->Position = 0;
        *(byte *)pFVar6 = *(byte *)pFVar6 & 0xef;
        uVar3 = FRandom::GenRand32(&M_Random);
        pFVar6->Random = uVar3 & 0xff;
        return true;
      }
      pFVar6 = pFVar6 + 1;
    }
  }
  return false;
}

Assistant:

bool FMugShot::SetState(const char *state_name, bool wait_till_done, bool reset)
{
	// Search for full name.
	FMugShotState *state = FindMugShotState(FName(state_name, true));
	if (state == NULL)
	{
		// Search for initial name, if the full one contains a dot.
		const char *dot = strchr(state_name, '.');
		if (dot != NULL)
		{
			state = FindMugShotState(FName(state_name, dot - state_name, true));
		}
		if (state == NULL)
		{
			// Requested state does not exist, so do nothing.
			return false;
		}
	}
	bNormal = false; //Assume we are not setting god or normal for now.
	bOuchActive = false;
	if (state != CurrentState)
	{
		if (!wait_till_done || CurrentState == NULL || CurrentState->bFinished)
		{
			CurrentState = state;
			state->Reset();
			return true;
		}
		return false;
	}
	else if(reset)
	{
		state->Reset();
		return true;
	}
	return true;
}